

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::PushScope(cmMakefile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Elt_pointer piVar2;
  long entryPointLine;
  string commandName;
  string local_48;
  Snapshot local_28;
  
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  if ((this->ContextStack).
      super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->ContextStack).
      super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    entryPointLine = 0;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_48);
    entryPointLine =
         (this->ContextStack).
         super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1]->Line;
  }
  cmState::CreateVariableScopeSnapshot
            (&local_28,this->GlobalGenerator->CMakeInstance->State,this->StateSnapshot,&local_48,
             entryPointLine);
  (this->StateSnapshot).Position.Position = local_28.Position.Position;
  (this->StateSnapshot).State = (cmState *)CONCAT44(local_28.State._4_4_,local_28.State._0_4_);
  (this->StateSnapshot).Position.Tree = local_28.Position.Tree;
  local_28.State._0_4_ = 0;
  piVar2 = (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar2 == (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,_std::allocator<int>_>::_M_push_back_aux<int>
              (&(this->LoopBlockCounter).c,(int *)&local_28);
  }
  else {
    *piVar2 = 0;
    (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = piVar2 + 1;
  }
  cmFileLockPool::PushFunctionScope(&this->GlobalGenerator->FileLockPool);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmMakefile::PushScope()
{
  std::string commandName;
  long line = 0;
  if (!this->ContextStack.empty())
    {
    commandName = this->ContextStack.back()->Name;
    line = this->ContextStack.back()->Line;
    }
  this->StateSnapshot = this->GetState()->CreateVariableScopeSnapshot(
        this->StateSnapshot,
        commandName,
        line);
  this->PushLoopBlockBarrier();

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PushFunctionScope();
#endif
}